

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O2

void __thiscall Jupiter::HTTP::Server::Data::Data(Data *this)

{
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->m_sessions).
  super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sessions).
  super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ports).
  super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ports).
  super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_hosts).
  super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ports).
  super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_hosts).
  super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_hosts).
  super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sessions).
  super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->session_timeout).__r = 2000;
  (this->keep_alive_session_timeout).__r = 5000;
  this->max_request_size = 0x2000;
  this->permit_keept_alive = true;
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_40 + 8),
               "",0);
  std::make_unique<Jupiter::HTTP::Server::Host,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::
  vector<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>,std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>>>
  ::
  emplace_back<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>>
            ((vector<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>,std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>>>
              *)this,(unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
                      *)local_40);
  if (local_40 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_40 + 0x30))();
  }
  local_40 = (undefined1  [8])0x0;
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return;
}

Assistant:

Jupiter::HTTP::Server::Data::Data() {
	// hosts[0] is always the "global" namespace.
	m_hosts.push_back(std::make_unique<Host>(""s));
}